

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yang_print_parsed_body(lys_ypr_ctx *pctx,lysp_module *modp)

{
  byte *pbVar1;
  lysp_node_grp **pplVar2;
  lysp_node **pplVar3;
  lysp_node_augment **pplVar4;
  lysp_node_action **pplVar5;
  lysp_node_notif **pplVar6;
  ushort uVar7;
  lysp_feature *plVar8;
  lysp_node_grp *grp;
  lysp_node *node;
  lysp_node_augment *aug;
  lysp_node_action *action;
  lysp_node_notif *notif;
  lysp_deviation *plVar9;
  lysp_deviate *plVar10;
  ly_out *out;
  lysp_deviate *plVar11;
  long lVar12;
  uint16_t uVar13;
  uint uVar14;
  lysp_ext_instance *plVar15;
  lysp_ext_instance *plVar16;
  char *pcVar17;
  char *pcVar18;
  lysp_ext_instance *plVar19;
  ulong uVar20;
  lysp_ext_instance *plVar21;
  uint16_t *puVar22;
  ulong uVar23;
  lysp_ident *plVar24;
  lysp_ext *plVar25;
  lysp_node_grp **pplVar26;
  lysp_node **pplVar27;
  lysp_node_augment **pplVar28;
  lysp_node_action **pplVar29;
  lysp_node_notif **pplVar30;
  lysc_ext *plVar31;
  long lVar32;
  lysp_deviate **pplVar33;
  ly_bool local_44;
  ly_bool flag;
  ly_bool local_42;
  ly_bool local_41;
  lysp_module *local_40;
  lysp_ext_instance *local_38;
  
  plVar31 = (lysc_ext *)0x0;
  local_40 = modp;
  while (modp->extensions != (lysp_ext *)0x0) {
    uVar7 = (pctx->field_0).field_0.flags;
    if (modp->extensions[-1].compiled <= plVar31) {
      (pctx->field_0).field_0.flags = uVar7 | 1;
      break;
    }
    uVar14 = (pctx->field_0).field_0.options;
    if (((uVar7 & 1) != 0) && ((pctx->field_0).field_0.flags = uVar7 & 0xfffe, (uVar14 & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
      uVar14 = (pctx->field_0).field_0.options;
    }
    plVar25 = modp->extensions + (long)plVar31;
    uVar23 = 0;
    flag = '\0';
    local_44 = '\0';
    if ((uVar14 & 2) == 0) {
      uVar23 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    ly_print_((pctx->field_0).field_0.out,"%*sextension %s",uVar23,"",plVar25->name);
    puVar22 = &(pctx->field_0).field_0.level;
    *puVar22 = *puVar22 + 1;
    yprp_extension_instances(pctx,LY_STMT_EXTENSION,'\0',plVar25->exts,&flag);
    if (plVar25->argname != (char *)0x0) {
      ypr_open((pctx->field_0).field_0.out,&flag);
      uVar23 = 0;
      if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
          (undefined1  [24])0x0) {
        uVar23 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_((pctx->field_0).field_0.out,"%*sargument %s",uVar23);
      puVar22 = &(pctx->field_0).field_0.level;
      *puVar22 = *puVar22 + 1;
      plVar19 = plVar25->exts;
      if (plVar19 == (lysp_ext_instance *)0x0) {
        plVar19 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar15 = (lysp_ext_instance *)0xffffffffffffffff;
        while( true ) {
          plVar15 = (lysp_ext_instance *)
                    lysp_ext_instance_iter
                              (plVar19,(uint64_t)((long)&plVar15->name + 1),LY_STMT_ARGUMENT);
          plVar19 = plVar25->exts;
          if (plVar19 == (lysp_ext_instance *)0x0) {
            plVar16 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar16 = plVar19[-1].exts;
          }
          modp = local_40;
          if (plVar15 == plVar16) break;
          yprp_extension_instance(pctx,LY_STMT_ARGUMENT,'\0',plVar19 + (long)plVar15,&local_44);
          plVar19 = plVar25->exts;
        }
      }
      if ((plVar25->flags & 0x180) == 0) {
        if (plVar19 != (lysp_ext_instance *)0x0) {
          plVar15 = (lysp_ext_instance *)lysp_ext_instance_iter(plVar19,0,LY_STMT_YIN_ELEMENT);
          plVar19 = (lysp_ext_instance *)0x0;
          if (plVar25->exts != (lysp_ext_instance *)0x0) {
            plVar19 = plVar25->exts[-1].exts;
          }
          if (plVar15 != plVar19) goto LAB_001842c2;
        }
      }
      else {
LAB_001842c2:
        ypr_open((pctx->field_0).field_0.out,&local_44);
        pcVar18 = "true";
        if (-1 < (char)plVar25->flags) {
          pcVar18 = "false";
        }
        ypr_substmt(pctx,LY_STMT_YIN_ELEMENT,'\0',pcVar18,'\0',plVar25->exts);
      }
      puVar22 = &(pctx->field_0).field_0.level;
      *puVar22 = *puVar22 - 1;
      ypr_close(pctx,local_44);
    }
    ypr_status(pctx,plVar25->flags,plVar25->exts,&flag);
    ypr_description(pctx,plVar25->dsc,plVar25->exts,&flag);
    ypr_reference(pctx,plVar25->ref,plVar25->exts,&flag);
    puVar22 = &(pctx->field_0).field_0.level;
    *puVar22 = *puVar22 - 1;
    ypr_close(pctx,flag);
    plVar31 = (lysc_ext *)((long)&plVar31->name + 1);
  }
  plVar19 = modp->exts;
  puVar22 = &plVar19->flags;
  plVar15 = (lysp_ext_instance *)0xffffffffffffffff;
  do {
    if (plVar19 == (lysp_ext_instance *)0x0) {
      plVar16 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar16 = plVar19[-1].exts;
    }
    plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
    if (plVar16 <= plVar15) goto LAB_0018440e;
    uVar13 = *puVar22;
    puVar22 = puVar22 + 0x38;
  } while ((uVar13 & 0x1000) != 0);
  uVar7 = (pctx->field_0).field_0.flags;
  if (((uVar7 & 1) != 0) &&
     ((pctx->field_0).field_0.flags = uVar7 & 0xfffe,
     (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
     (undefined1  [24])0x0)) {
    ly_print_((pctx->field_0).field_0.out,"\n");
  }
  yprp_extension_instances(pctx,LY_STMT_MODULE,'\0',modp->exts,(ly_bool *)0x0);
  plVar19 = modp->exts;
LAB_0018440e:
  if (plVar19 != (lysp_ext_instance *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  lVar32 = 0x38;
  uVar23 = 0;
  while (modp->features != (lysp_feature *)0x0) {
    uVar7 = (pctx->field_0).field_0.flags;
    if (*(ulong *)&modp->features[-1].flags <= uVar23) {
      (pctx->field_0).field_0.flags = uVar7 | 1;
      break;
    }
    uVar14 = (pctx->field_0).field_0.options;
    if (((uVar7 & 1) != 0) && ((pctx->field_0).field_0.flags = uVar7 & 0xfffe, (uVar14 & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
      uVar14 = (pctx->field_0).field_0.options;
    }
    plVar8 = modp->features;
    local_42 = '\0';
    uVar20 = 0;
    if ((uVar14 & 2) == 0) {
      uVar20 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    ly_print_((pctx->field_0).field_0.out,"%*sfeature %s",uVar20,"",
              *(undefined8 *)((long)plVar8 + lVar32 + -0x38));
    puVar22 = &(pctx->field_0).field_0.level;
    *puVar22 = *puVar22 + 1;
    yprp_extension_instances
              (pctx,LY_STMT_FEATURE,'\0',*(lysp_ext_instance **)((long)plVar8 + lVar32 + -8),
               &local_42);
    yprp_iffeatures(pctx,*(lysp_qname **)((long)plVar8 + lVar32 + -0x30),
                    *(lysp_ext_instance **)((long)plVar8 + lVar32 + -8),&local_42);
    ypr_status(pctx,*(uint16_t *)((long)&plVar8->name + lVar32),
               *(void **)((long)plVar8 + lVar32 + -8),&local_42);
    ypr_description(pctx,*(char **)((long)plVar8 + lVar32 + -0x18),
                    *(void **)((long)plVar8 + lVar32 + -8),&local_42);
    ypr_reference(pctx,*(char **)((long)plVar8 + lVar32 + -0x10),
                  *(void **)((long)plVar8 + lVar32 + -8),&local_42);
    puVar22 = &(pctx->field_0).field_0.level;
    *puVar22 = *puVar22 - 1;
    ypr_close(pctx,local_42);
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
    uVar23 = uVar23 + 1;
    lVar32 = lVar32 + 0x40;
    modp = local_40;
  }
  uVar23 = 0;
  while (modp->identities != (lysp_ident *)0x0) {
    uVar7 = (pctx->field_0).field_0.flags;
    if (*(ulong *)&modp->identities[-1].flags <= uVar23) {
      (pctx->field_0).field_0.flags = uVar7 | 1;
      break;
    }
    uVar14 = (pctx->field_0).field_0.options;
    if (((uVar7 & 1) != 0) && ((pctx->field_0).field_0.flags = uVar7 & 0xfffe, (uVar14 & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
      uVar14 = (pctx->field_0).field_0.options;
    }
    plVar24 = modp->identities + uVar23;
    local_41 = '\0';
    uVar20 = 0;
    if ((uVar14 & 2) == 0) {
      uVar20 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    ly_print_((pctx->field_0).field_0.out,"%*sidentity %s",uVar20,"",plVar24->name);
    puVar22 = &(pctx->field_0).field_0.level;
    *puVar22 = *puVar22 + 1;
    yprp_extension_instances(pctx,LY_STMT_IDENTITY,'\0',plVar24->exts,&local_41);
    yprp_iffeatures(pctx,plVar24->iffeatures,plVar24->exts,&local_41);
    pcVar18 = (char *)0x0;
    while( true ) {
      if (plVar24->bases == (char **)0x0) {
        pcVar17 = (char *)0x0;
      }
      else {
        pcVar17 = plVar24->bases[-1];
      }
      if (pcVar17 <= pcVar18) break;
      ypr_open((pctx->field_0).field_0.out,&local_41);
      ypr_substmt(pctx,LY_STMT_BASE,(uint8_t)pcVar18,plVar24->bases[(long)pcVar18],'\0',
                  plVar24->exts);
      pcVar18 = pcVar18 + 1;
    }
    ypr_status(pctx,plVar24->flags,plVar24->exts,&local_41);
    ypr_description(pctx,plVar24->dsc,plVar24->exts,&local_41);
    ypr_reference(pctx,plVar24->ref,plVar24->exts,&local_41);
    puVar22 = &(pctx->field_0).field_0.level;
    *puVar22 = *puVar22 - 1;
    ypr_close(pctx,local_41);
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
    uVar23 = uVar23 + 1;
    modp = local_40;
  }
  lVar32 = 0;
  uVar23 = 0;
  do {
    if (modp->typedefs == (lysp_tpdf *)0x0) {
LAB_00184703:
      pplVar2 = &local_40->groupings;
      pplVar26 = pplVar2;
      while (grp = *pplVar26, grp != (lysp_node_grp *)0x0) {
        uVar7 = (pctx->field_0).field_0.flags;
        if (((uVar7 & 1) != 0) &&
           ((pctx->field_0).field_0.flags = uVar7 & 0xfffe,
           (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
           (undefined1  [24])0x0)) {
          ly_print_((pctx->field_0).field_0.out,"\n");
        }
        yprp_grouping(pctx,grp);
        pbVar1 = (byte *)((long)&pctx->field_0 + 10);
        *pbVar1 = *pbVar1 | 1;
        pplVar26 = &(grp->field_0).field_1.next;
      }
      if (*pplVar2 != (lysp_node_grp *)0x0) {
        pbVar1 = (byte *)((long)&pctx->field_0 + 10);
        *pbVar1 = *pbVar1 | 1;
      }
      pplVar3 = &local_40->data;
      pplVar27 = pplVar3;
      while (node = *pplVar27, node != (lysp_node *)0x0) {
        uVar7 = (pctx->field_0).field_0.flags;
        if (((uVar7 & 1) != 0) &&
           ((pctx->field_0).field_0.flags = uVar7 & 0xfffe,
           (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
           (undefined1  [24])0x0)) {
          ly_print_((pctx->field_0).field_0.out,"\n");
        }
        yprp_node(pctx,node);
        pplVar27 = &node->next;
      }
      if (*pplVar3 != (lysp_node *)0x0) {
        pbVar1 = (byte *)((long)&pctx->field_0 + 10);
        *pbVar1 = *pbVar1 | 1;
      }
      pplVar4 = &local_40->augments;
      pplVar28 = pplVar4;
      while (aug = *pplVar28, aug != (lysp_node_augment *)0x0) {
        uVar7 = (pctx->field_0).field_0.flags;
        if (((uVar7 & 1) != 0) &&
           ((pctx->field_0).field_0.flags = uVar7 & 0xfffe,
           (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
           (undefined1  [24])0x0)) {
          ly_print_((pctx->field_0).field_0.out,"\n");
        }
        yprp_augment(pctx,aug);
        pplVar28 = &(aug->field_0).field_1.next;
      }
      if (*pplVar4 != (lysp_node_augment *)0x0) {
        pbVar1 = (byte *)((long)&pctx->field_0 + 10);
        *pbVar1 = *pbVar1 | 1;
      }
      pplVar5 = &local_40->rpcs;
      pplVar29 = pplVar5;
      while (action = *pplVar29, action != (lysp_node_action *)0x0) {
        uVar7 = (pctx->field_0).field_0.flags;
        if (((uVar7 & 1) != 0) &&
           ((pctx->field_0).field_0.flags = uVar7 & 0xfffe,
           (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
           (undefined1  [24])0x0)) {
          ly_print_((pctx->field_0).field_0.out,"\n");
        }
        yprp_action(pctx,action);
        pplVar29 = &(action->field_0).field_1.next;
      }
      if (*pplVar5 != (lysp_node_action *)0x0) {
        pbVar1 = (byte *)((long)&pctx->field_0 + 10);
        *pbVar1 = *pbVar1 | 1;
      }
      pplVar6 = &local_40->notifs;
      pplVar30 = pplVar6;
      while (notif = *pplVar30, notif != (lysp_node_notif *)0x0) {
        uVar7 = (pctx->field_0).field_0.flags;
        if (((uVar7 & 1) != 0) &&
           ((pctx->field_0).field_0.flags = uVar7 & 0xfffe,
           (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
           (undefined1  [24])0x0)) {
          ly_print_((pctx->field_0).field_0.out,"\n");
        }
        yprp_notification(pctx,notif);
        pplVar30 = &(notif->field_0).field_1.next;
      }
      if (*pplVar6 != (lysp_node_notif *)0x0) {
        pbVar1 = (byte *)((long)&pctx->field_0 + 10);
        *pbVar1 = *pbVar1 | 1;
      }
      plVar19 = (lysp_ext_instance *)0x0;
      do {
        if (local_40->deviations == (lysp_deviation *)0x0) {
          return;
        }
        uVar7 = (pctx->field_0).field_0.flags;
        if (local_40->deviations[-1].exts <= plVar19) {
          (pctx->field_0).field_0.flags = uVar7 | 1;
          return;
        }
        uVar14 = (pctx->field_0).field_0.options;
        if (((uVar7 & 1) != 0) &&
           ((pctx->field_0).field_0.flags = uVar7 & 0xfffe, (uVar14 & 2) == 0)) {
          ly_print_((pctx->field_0).field_0.out,"\n");
          uVar14 = (pctx->field_0).field_0.options;
        }
        plVar9 = local_40->deviations;
        uVar23 = 0;
        if ((uVar14 & 2) == 0) {
          uVar23 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
        }
        local_38 = plVar19;
        ly_print_((pctx->field_0).field_0.out,"%*sdeviation \"%s\" {\n",uVar23,"");
        puVar22 = &(pctx->field_0).field_0.level;
        *puVar22 = *puVar22 + 1;
        yprp_extension_instances
                  (pctx,LY_STMT_DEVIATION,'\0',plVar9[(long)plVar19].exts,(ly_bool *)0x0);
        ypr_description(pctx,plVar9[(long)plVar19].dsc,plVar9[(long)plVar19].exts,(ly_bool *)0x0);
        ypr_reference(pctx,plVar9[(long)plVar19].ref,plVar9[(long)plVar19].exts,(ly_bool *)0x0);
        pplVar33 = &plVar9[(long)plVar19].deviates;
        while (plVar10 = *pplVar33, plVar10 != (lysp_deviate *)0x0) {
          uVar23 = 0;
          if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
              (undefined1  [24])0x0) {
            uVar23 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
          }
          ly_print_((pctx->field_0).field_0.out,"%*sdeviate ",uVar23,"");
          switch(plVar10->mod) {
          case '\x01':
            out = (pctx->field_0).field_0.out;
            if (plVar10->exts != (lysp_ext_instance *)0x0) {
              ly_print_(out,"not-supported {\n");
              puVar22 = &(pctx->field_0).field_0.level;
              *puVar22 = *puVar22 + 1;
              yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar10->exts,(ly_bool *)0x0);
              break;
            }
            ly_print_(out,"not-supported;\n");
            goto LAB_00184daa;
          case '\x02':
            ly_print_((pctx->field_0).field_0.out,"add {\n");
            puVar22 = &(pctx->field_0).field_0.level;
            *puVar22 = *puVar22 + 1;
            yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar10->exts,(ly_bool *)0x0);
            plVar19 = plVar10->exts;
            ypr_substmt(pctx,LY_STMT_UNITS,'\0',*(char **)(plVar10 + 1),'\0',plVar19);
            lVar32 = 0;
            plVar15 = (lysp_ext_instance *)0x0;
            while( true ) {
              plVar11 = plVar10[1].next;
              if (plVar11 == (lysp_deviate *)0x0) {
                plVar16 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar16 = plVar11[-1].exts;
              }
              if (plVar16 <= plVar15) break;
              yprp_restr(pctx,(lysp_restr *)(&plVar11->mod + lVar32),LY_STMT_MUST,(ly_bool *)0x0);
              plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
              lVar32 = lVar32 + 0x40;
            }
            lVar32 = 0x10;
            plVar15 = (lysp_ext_instance *)0x0;
            while( true ) {
              plVar16 = plVar10[1].exts;
              if (plVar16 == (lysp_ext_instance *)0x0) {
                plVar21 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar21 = plVar16[-1].exts;
              }
              if (plVar21 <= plVar15) break;
              plVar19 = plVar10->exts;
              ypr_substmt(pctx,LY_STMT_UNIQUE,(uint8_t)plVar15,
                          *(char **)((long)plVar16 + lVar32 + -0x10),
                          *(byte *)((long)&plVar16->name + lVar32 + 1) & 1,plVar19);
              plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
              lVar32 = lVar32 + 0x18;
            }
            lVar32 = 0x10;
            uVar23 = 0;
            while( true ) {
              lVar12 = *(long *)(plVar10 + 2);
              if (lVar12 == 0) {
                uVar20 = 0;
              }
              else {
                uVar20 = *(ulong *)(lVar12 + -8);
              }
              if (uVar20 <= uVar23) break;
              plVar19 = plVar10->exts;
              ypr_substmt(pctx,LY_STMT_DEFAULT,(uint8_t)uVar23,*(char **)(lVar12 + -0x10 + lVar32),
                          *(byte *)(lVar12 + 1 + lVar32) & 1,plVar19);
              uVar23 = uVar23 + 1;
              lVar32 = lVar32 + 0x18;
            }
            ypr_config(pctx,*(uint16_t *)&plVar10[2].next,plVar10->exts,(ly_bool *)0x0);
            ypr_mandatory(pctx,*(uint16_t *)&plVar10[2].next,plVar10->exts,(ly_bool *)0x0);
            uVar14 = *(uint *)&plVar10[2].next;
            if ((uVar14 >> 9 & 1) != 0) {
              ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,(uint8_t)plVar10->exts,
                           (void *)(ulong)*(uint *)((long)&plVar10[2].next + 4),0,(ly_bool *)plVar19
                          );
              uVar14 = (uint)*(ushort *)&plVar10[2].next;
            }
            if ((uVar14 >> 10 & 1) != 0) {
              uVar14 = *(uint *)&plVar10[2].exts;
LAB_00184d6c:
              plVar19 = plVar10->exts;
              if ((void *)(ulong)uVar14 == (void *)0x0) {
                ypr_substmt(pctx,LY_STMT_MAX_ELEMENTS,'\0',"unbounded",'\0',plVar19);
              }
              else {
                ypr_unsigned(pctx,LY_STMT_MAX_ELEMENTS,(uint8_t)plVar19,(void *)(ulong)uVar14,0,
                             (ly_bool *)plVar19);
              }
            }
            break;
          case '\x03':
            ly_print_((pctx->field_0).field_0.out,"delete {\n");
            puVar22 = &(pctx->field_0).field_0.level;
            *puVar22 = *puVar22 + 1;
            yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar10->exts,(ly_bool *)0x0);
            ypr_substmt(pctx,LY_STMT_UNITS,'\0',*(char **)(plVar10 + 1),'\0',plVar10->exts);
            lVar32 = 0;
            plVar19 = (lysp_ext_instance *)0x0;
            while( true ) {
              plVar11 = plVar10[1].next;
              if (plVar11 == (lysp_deviate *)0x0) {
                plVar15 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar15 = plVar11[-1].exts;
              }
              if (plVar15 <= plVar19) break;
              yprp_restr(pctx,(lysp_restr *)(&plVar11->mod + lVar32),LY_STMT_MUST,(ly_bool *)0x0);
              plVar19 = (lysp_ext_instance *)((long)&plVar19->name + 1);
              lVar32 = lVar32 + 0x40;
            }
            lVar32 = 0x10;
            plVar19 = (lysp_ext_instance *)0x0;
            while( true ) {
              plVar15 = plVar10[1].exts;
              if (plVar15 == (lysp_ext_instance *)0x0) {
                plVar16 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar16 = plVar15[-1].exts;
              }
              if (plVar16 <= plVar19) break;
              ypr_substmt(pctx,LY_STMT_UNIQUE,(uint8_t)plVar19,
                          *(char **)((long)plVar15 + lVar32 + -0x10),
                          *(byte *)((long)&plVar15->name + lVar32 + 1) & 1,plVar10->exts);
              plVar19 = (lysp_ext_instance *)((long)&plVar19->name + 1);
              lVar32 = lVar32 + 0x18;
            }
            lVar32 = 0x10;
            uVar23 = 0;
            while( true ) {
              lVar12 = *(long *)(plVar10 + 2);
              if (lVar12 == 0) {
                uVar20 = 0;
              }
              else {
                uVar20 = *(ulong *)(lVar12 + -8);
              }
              if (uVar20 <= uVar23) break;
              ypr_substmt(pctx,LY_STMT_DEFAULT,(uint8_t)uVar23,*(char **)(lVar12 + -0x10 + lVar32),
                          *(byte *)(lVar12 + 1 + lVar32) & 1,plVar10->exts);
              uVar23 = uVar23 + 1;
              lVar32 = lVar32 + 0x18;
            }
            break;
          case '\x04':
            ly_print_((pctx->field_0).field_0.out,"replace {\n");
            puVar22 = &(pctx->field_0).field_0.level;
            *puVar22 = *puVar22 + 1;
            yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar10->exts,(ly_bool *)0x0);
            if (*(lysp_type **)(plVar10 + 1) != (lysp_type *)0x0) {
              yprp_type(pctx,*(lysp_type **)(plVar10 + 1));
            }
            ypr_substmt(pctx,LY_STMT_UNITS,'\0',(char *)plVar10[1].next,'\0',plVar10->exts);
            plVar19 = plVar10->exts;
            ypr_substmt(pctx,LY_STMT_DEFAULT,'\0',(char *)plVar10[1].exts,
                        *(byte *)((long)&plVar10[2].next + 1) & 1,plVar19);
            ypr_config(pctx,*(uint16_t *)&plVar10[2].exts,plVar10->exts,(ly_bool *)0x0);
            ypr_mandatory(pctx,*(uint16_t *)&plVar10[2].exts,plVar10->exts,(ly_bool *)0x0);
            uVar14 = *(uint *)&plVar10[2].exts;
            if ((uVar14 >> 9 & 1) != 0) {
              ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,(uint8_t)plVar10->exts,
                           (void *)(ulong)*(uint *)((long)&plVar10[2].exts + 4),0,(ly_bool *)plVar19
                          );
              uVar14 = (uint)*(ushort *)&plVar10[2].exts;
            }
            if ((uVar14 >> 10 & 1) != 0) {
              uVar14 = *(uint *)(plVar10 + 3);
              goto LAB_00184d6c;
            }
          }
          puVar22 = &(pctx->field_0).field_0.level;
          *puVar22 = *puVar22 - 1;
          ypr_close(pctx,'\x01');
LAB_00184daa:
          pplVar33 = &plVar10->next;
        }
        puVar22 = &(pctx->field_0).field_0.level;
        *puVar22 = *puVar22 - 1;
        ypr_close(pctx,'\x01');
        plVar19 = (lysp_ext_instance *)((long)&local_38->name + 1);
      } while( true );
    }
    uVar7 = (pctx->field_0).field_0.flags;
    if (*(ulong *)&modp->typedefs[-1].flags <= uVar23) {
      (pctx->field_0).field_0.flags = uVar7 | 1;
      goto LAB_00184703;
    }
    if (((uVar7 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar7 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    modp = local_40;
    yprp_typedef(pctx,(lysp_tpdf *)((long)&local_40->typedefs->name + lVar32));
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
    uVar23 = uVar23 + 1;
    lVar32 = lVar32 + 0xb0;
  } while( true );
}

Assistant:

static void
yang_print_parsed_body(struct lys_ypr_ctx *pctx, const struct lysp_module *modp)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_node *data;
    struct lysp_node_action *action;
    struct lysp_node_notif *notif;
    struct lysp_node_grp *grp;
    struct lysp_node_augment *aug;

    LY_ARRAY_FOR(modp->extensions, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_extension(pctx, &modp->extensions[u]);
    }

    YPR_EXTRA_LINE(modp->extensions, pctx);

    if (yprp_extension_has_printable_instances(modp->exts)) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_extension_instances(pctx, LY_STMT_MODULE, 0, modp->exts, NULL);
    }

    YPR_EXTRA_LINE(modp->exts, pctx);

    LY_ARRAY_FOR(modp->features, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_feature(pctx, &modp->features[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->features, pctx);

    LY_ARRAY_FOR(modp->identities, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_identity(pctx, &modp->identities[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->identities, pctx);

    LY_ARRAY_FOR(modp->typedefs, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_typedef(pctx, &modp->typedefs[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->typedefs, pctx);

    LY_LIST_FOR(modp->groupings, grp) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_grouping(pctx, grp);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->groupings, pctx);

    LY_LIST_FOR(modp->data, data) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_node(pctx, data);
    }

    YPR_EXTRA_LINE(modp->data, pctx);

    LY_LIST_FOR(modp->augments, aug) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_augment(pctx, aug);
    }

    YPR_EXTRA_LINE(modp->augments, pctx);

    LY_LIST_FOR(modp->rpcs, action) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_action(pctx, action);
    }

    YPR_EXTRA_LINE(modp->rpcs, pctx);

    LY_LIST_FOR(modp->notifs, notif) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_notification(pctx, notif);
    }

    YPR_EXTRA_LINE(modp->notifs, pctx);

    LY_ARRAY_FOR(modp->deviations, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_deviation(pctx, &modp->deviations[u]);
    }

    YPR_EXTRA_LINE(modp->deviations, pctx);
}